

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O1

void __thiscall QSequentialAnimationGroupPrivate::restart(QSequentialAnimationGroupPrivate *this)

{
  QBindingStatus *pQVar1;
  qsizetype qVar2;
  parameter_type pVar3;
  int index;
  
  pVar3 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
          ::value(&(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.direction);
  if (pVar3 == Forward) {
    this->lastLoop = 0;
    if (this->currentAnimationIndex == 0) goto LAB_003b9eeb;
    index = 0;
  }
  else {
    pQVar1 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
             super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
    if ((pQVar1 != (QBindingStatus *)0x0) &&
       (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
      QBindingStorage::registerDependency_helper
                (&(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
                  super_QObjectPrivate.super_QObjectData.bindingStorage,
                 (QUntypedPropertyData *)
                 &(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.loopCount);
    }
    qVar2 = (this->super_QAnimationGroupPrivate).animations.d.size;
    this->lastLoop =
         (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.loopCount.
         super_QPropertyData<int>.val + -1;
    index = (int)qVar2 + -1;
    if (this->currentAnimationIndex == index) {
LAB_003b9eeb:
      activateCurrentAnimation(this,false);
      return;
    }
  }
  setCurrentAnimation(this,index,false);
  return;
}

Assistant:

void QSequentialAnimationGroupPrivate::restart()
{
    // restarting the group by making the first/last animation the current one
    if (direction == QAbstractAnimation::Forward) {
        lastLoop = 0;
        if (currentAnimationIndex == 0)
            activateCurrentAnimation();
        else
            setCurrentAnimation(0);
    } else { // direction == QAbstractAnimation::Backward
        lastLoop = loopCount - 1;
        int index = animations.size() - 1;
        if (currentAnimationIndex == index)
            activateCurrentAnimation();
        else
            setCurrentAnimation(index);
    }
}